

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O2

_Bool obj_kind_can_browse(object_kind *kind)

{
  wchar_t wVar1;
  class_book *pcVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  wVar1 = (player->class->magic).num_books;
  uVar3 = 0;
  uVar4 = 0;
  if (L'\0' < wVar1) {
    uVar4 = (ulong)(uint)wVar1;
  }
  for (lVar5 = 4;
      (uVar4 != uVar3 &&
      ((pcVar2 = (player->class->magic).books, kind->tval != *(int *)((long)pcVar2 + lVar5 + -4) ||
       (kind->sval != *(int *)((long)&pcVar2->tval + lVar5))))); lVar5 = lVar5 + 0x20) {
    uVar3 = uVar3 + 1;
  }
  return (long)uVar3 < (long)wVar1;
}

Assistant:

bool obj_kind_can_browse(const struct object_kind *kind)
{
	int i;

	for (i = 0; i < player->class->magic.num_books; i++) {
		struct class_book book = player->class->magic.books[i];
		if (kind->tval == book.tval && kind->sval == book.sval)
			return true;
	}

	return false;
}